

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costEvaluation
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  PointerType pdVar7;
  double **ppdVar8;
  plainobjectbase_evaluator_data<double,_0> pVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar10;
  double *pdVar11;
  bool isValid;
  ostringstream errorMsg;
  char local_222;
  scalar_sum_op<double,_double> local_221;
  double local_220;
  undefined1 local_218 [16];
  double *local_208;
  PointerType local_200;
  variable_if_dynamic<long,__1> local_1f8;
  variable_if_dynamic<long,__1> local_1e8;
  double **local_1e0;
  double *local_1d8;
  double **local_1d0;
  double ***local_1c8;
  double **local_1c0;
  double **local_1b8;
  undefined1 local_1b0 [56];
  PointerType local_178;
  variable_if_dynamic<long,__1> local_170;
  ios_base local_140 [264];
  VectorDynSize *local_38;
  
  local_222 = '\0';
  peVar1 = (this->m_timeVaryingStateHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_220 = time;
  if (peVar1 == (element_type *)0x0) {
    local_1e0 = (double **)0x0;
  }
  else {
    (*peVar1->_vptr_TimeVaryingObject[2])(time,peVar1,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid state hessian at time: ",0x32);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::MatrixDynSize::cols();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The state hessian at time: ",0x1b);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not squared.",0x10);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The hessian at time: ",0x15);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," does not match the state dimension.",0x24);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    local_1d8 = costValue;
    local_1e0 = (double **)iDynTree::VectorDynSize::data();
    local_1d0 = (double **)iDynTree::VectorDynSize::size();
    local_1b8 = (double **)iDynTree::MatrixDynSize::data();
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::MatrixDynSize::cols();
    pdVar7 = (PointerType)iDynTree::VectorDynSize::data();
    local_170.m_value = iDynTree::VectorDynSize::size();
    local_1c8 = &local_1c0;
    local_1b0._0_8_ = local_1e0;
    local_1b0._8_8_ = local_1d0;
    local_1b0._24_8_ = local_1b8;
    local_1b0._32_8_ = lVar5;
    local_1b0._40_8_ = lVar6;
    local_178 = pdVar7;
    local_1c0 = (double **)0x0;
    if (local_170.m_value != 0) {
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_218 + 8),(XprType *)local_1b0);
      local_1f8.m_value = (long)local_178;
      local_1e8.m_value = local_170.m_value;
      local_1e0 = (double **)
                  Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                  ::
                  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                            ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                              *)local_218,&local_221,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_1b0);
      free(local_208);
      local_1c0 = local_1e0;
    }
    local_1e0 = (double **)((double)*local_1c8 * 0.5 + 0.0);
    costValue = local_1d8;
  }
  peVar2 = (this->m_timeVaryingStateGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_222 = '\0';
    local_1d8 = costValue;
    (*peVar2->_vptr_TimeVaryingObject[2])(local_220,peVar2,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid state gradient at time: ",0x33);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::VectorDynSize::size();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The gradient at time: ",0x16);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," have dimensions different from the state.",0x2a);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    ppdVar8 = (double **)iDynTree::VectorDynSize::data();
    pVar9.data = (double *)iDynTree::VectorDynSize::size();
    pdVar7 = (PointerType)iDynTree::VectorDynSize::data();
    local_1f8.m_value = iDynTree::VectorDynSize::size();
    local_1c8 = &local_1c0;
    local_218._0_8_ = ppdVar8;
    local_218._8_8_ = pVar9.data;
    local_200 = pdVar7;
    if ((PointerType)local_1f8.m_value == (PointerType)0x0) {
      local_1c0 = (double **)0x0;
    }
    else {
      local_1b0._8_8_ = ppdVar8;
      local_1b0._24_8_ = pVar9.data;
      local_1b0._32_8_ = pdVar7;
      local_1b0._48_8_ = local_1f8.m_value;
      local_1c0 = (double **)
                  Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                  ::
                  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                            ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                              *)local_1b0,&local_221,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_218);
    }
    local_1e0 = (double **)((double)local_1e0 + (double)*local_1c8);
    costValue = local_1d8;
  }
  peVar3 = (this->m_timeVaryingStateCostBias).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_222 = '\0';
    iVar4 = (*peVar3->_vptr_TimeVaryingObject[2])(local_220,peVar3,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid state cost bias at time: ",0x34);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    local_1e0 = (double **)((double)local_1e0 + *(double *)CONCAT44(extraout_var,iVar4));
  }
  peVar1 = (this->m_timeVaryingControlHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pdVar11 = (double *)0x0;
  }
  else {
    local_222 = '\0';
    (*peVar1->_vptr_TimeVaryingObject[2])(local_220,peVar1,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid control hessian at time: ",0x34);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::MatrixDynSize::cols();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The control hessian at time: ",0x1d);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not squared.",0x10);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The hessian at time: ",0x15);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," does not match the control dimension.",0x26);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    local_1d8 = costValue;
    local_1d0 = (double **)iDynTree::VectorDynSize::data();
    local_1b8 = (double **)iDynTree::VectorDynSize::size();
    ppdVar8 = (double **)iDynTree::MatrixDynSize::data();
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::MatrixDynSize::cols();
    pdVar7 = (PointerType)iDynTree::VectorDynSize::data();
    local_38 = control;
    local_170.m_value = iDynTree::VectorDynSize::size();
    local_1c8 = &local_1c0;
    local_1b0._0_8_ = local_1d0;
    local_1b0._8_8_ = local_1b8;
    local_1b0._24_8_ = ppdVar8;
    local_1b0._32_8_ = lVar5;
    local_1b0._40_8_ = lVar6;
    local_178 = pdVar7;
    ppdVar8 = (double **)0x0;
    if (local_170.m_value != 0) {
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           *)(local_218 + 8),(XprType *)local_1b0);
      local_1f8.m_value = (long)local_178;
      local_1e8.m_value = local_170.m_value;
      local_1d0 = (double **)
                  Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                  ::
                  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                            ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                              *)local_218,&local_221,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_1b0);
      free(local_208);
      ppdVar8 = local_1d0;
    }
    local_1c0 = ppdVar8;
    pdVar11 = (double *)((double)*local_1c8 * 0.5 + 0.0);
    costValue = local_1d8;
  }
  peVar2 = (this->m_timeVaryingControlGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_222 = '\0';
    local_1d8 = pdVar11;
    (*peVar2->_vptr_TimeVaryingObject[2])(local_220,peVar2,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid control gradient at time: ",0x35);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    lVar5 = iDynTree::VectorDynSize::size();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 != lVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The control hessian at time ",0x1c);
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," have dimension different from the control dimension.",0x35);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
      goto LAB_001630e7;
    }
    ppdVar8 = (double **)iDynTree::VectorDynSize::data();
    pVar9.data = (double *)iDynTree::VectorDynSize::size();
    pdVar7 = (PointerType)iDynTree::VectorDynSize::data();
    local_1f8.m_value = iDynTree::VectorDynSize::size();
    local_1c8 = &local_1c0;
    local_218._0_8_ = ppdVar8;
    local_218._8_8_ = pVar9.data;
    local_200 = pdVar7;
    if ((PointerType)local_1f8.m_value == (PointerType)0x0) {
      local_1c0 = (double **)0x0;
    }
    else {
      local_1b0._8_8_ = ppdVar8;
      local_1b0._24_8_ = pVar9.data;
      local_1b0._32_8_ = pdVar7;
      local_1b0._48_8_ = local_1f8.m_value;
      local_1c0 = (double **)
                  Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                  ::
                  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                            ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                              *)local_1b0,&local_221,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_218);
    }
    pdVar11 = (double *)((double)local_1d8 + (double)*local_1c8);
  }
  peVar3 = (this->m_timeVaryingControlCostBias).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_222 = '\0';
    local_1d8 = pdVar11;
    iVar4 = (*peVar3->_vptr_TimeVaryingObject[2])(local_220,peVar3,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid control cost bias at time: ",0x36)
      ;
      poVar10 = std::ostream::_M_insert<double>(local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_218._0_8_);
LAB_001630e7:
      if ((double **)local_218._0_8_ != &local_208) {
        operator_delete((void *)local_218._0_8_,(long)local_208 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      return false;
    }
    pdVar11 = (double *)((double)local_1d8 + *(double *)CONCAT44(extraout_var_00,iVar4));
  }
  *costValue = (double)local_1e0 + (double)pdVar11;
  return true;
}

Assistant:

bool QuadraticLikeCost::costEvaluation(double time,
                                           const iDynTree::VectorDynSize& state,
                                           const iDynTree::VectorDynSize& control,
                                           double& costValue)
        {
            double stateCost = 0, controlCost = 0;

            bool isValid = false;
            if (m_timeVaryingStateHessian) {
                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += 0.5 * (toEigen(state).transpose() * toEigen(hessian) * toEigen(state))(0);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The gradient at time: " << time << " have dimensions different from the state.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += toEigen(gradient).transpose()*toEigen(state);
            }

            if (m_timeVaryingStateCostBias) {

                isValid = false;
                double stateBias = m_timeVaryingStateCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                stateCost += stateBias;
            }

            if (m_timeVaryingControlHessian) {

                isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += 0.5 * (toEigen(control).transpose() * toEigen(hessian) * toEigen(control))(0);
            }

            if (m_timeVaryingControlGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingControlGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (control.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time " << time << " have dimension different from the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                controlCost += toEigen(gradient).transpose()*toEigen(control);
            }

            if (m_timeVaryingControlCostBias) {

                isValid = false;
                double controlBias = m_timeVaryingControlCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += controlBias;
            }

            costValue = stateCost + controlCost;
            return true;
        }